

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_> __thiscall
flow::lang::Parser::varDecl(Parser *this)

{
  Lexer *pLVar1;
  long lVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  Symbol *this_00;
  pointer *__ptr;
  Parser *in_RSI;
  string name;
  SourceLocation loc;
  _func_int **local_88;
  string local_80;
  undefined1 local_60 [48];
  uint uStack_30;
  uint uStack_2c;
  
  pLVar1 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  lVar2 = *(long *)&(pLVar1->location_).filename._M_dataplus;
  local_60._0_8_ = local_60 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,lVar2,
             *(size_type *)((long)&(pLVar1->location_).filename + 8) + lVar2);
  uVar3 = *(undefined8 *)((long)&(pLVar1->location_).end + 4);
  uStack_30 = (uint)uVar3;
  uStack_2c = (uint)((ulong)uVar3 >> 0x20);
  local_60._32_8_ = *(undefined8 *)&(pLVar1->location_).begin;
  uVar3 = *(undefined8 *)((long)&(pLVar1->location_).begin + 8);
  local_60._40_4_ = (undefined4)uVar3;
  local_60._44_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  bVar5 = expect(in_RSI,Var);
  if (bVar5) {
    Lexer::nextToken((in_RSI->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
    bVar5 = expect(in_RSI,Ident);
    if (bVar5) {
      Lexer::nextToken((in_RSI->lexer_)._M_t.
                       super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                       .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
      pLVar1 = (in_RSI->lexer_)._M_t.
               super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
               _M_t.
               super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
               super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
      _Var4._M_p = (pLVar1->stringValue_)._M_dataplus._M_p;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,_Var4._M_p,_Var4._M_p + (pLVar1->stringValue_)._M_string_length
                );
      bVar5 = expect(in_RSI,Assign);
      if (bVar5) {
        Lexer::nextToken((in_RSI->lexer_)._M_t.
                         super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                         .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
        logicExpr((Parser *)&local_88);
        if (local_88 == (_func_int **)0x0) {
          this_00 = (Symbol *)0x0;
        }
        else {
          uStack_2c = *(uint *)((long)local_88 + 0x3c);
          local_60._44_4_ = (undefined4)*(undefined8 *)((long)local_88 + 0x34);
          uStack_30 = (uint)((ulong)*(undefined8 *)((long)local_88 + 0x34) >> 0x20);
          bVar5 = expect(in_RSI,Semicolon);
          if (bVar5) {
            Lexer::nextToken((in_RSI->lexer_)._M_t.
                             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                             .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
          }
          this_00 = (Symbol *)operator_new(0x78);
          Symbol::Symbol(this_00,Variable,&local_80,(SourceLocation *)local_60);
          (this_00->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__VariableSym_00193a60;
          this_00[1].super_ASTNode._vptr_ASTNode = local_88;
        }
        *(Symbol **)&(this->features_)._M_t._M_impl = this_00;
      }
      else {
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        (ulong)(local_80.field_2._M_allocated_capacity + 1));
      }
      goto LAB_001228d7;
    }
  }
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
LAB_001228d7:
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
  }
  return (__uniq_ptr_data<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>,_true,_true>
          )(__uniq_ptr_data<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VariableSym> Parser::varDecl() {
  SourceLocation loc(lexer_->location());

  if (!consume(Token::Var)) return nullptr;

  if (!consume(Token::Ident)) return nullptr;

  std::string name = stringValue();

  if (!consume(Token::Assign)) return nullptr;

  std::unique_ptr<Expr> initializer = expr();
  if (!initializer) return nullptr;

  loc.update(initializer->location().end);
  consume(Token::Semicolon);

  return std::make_unique<VariableSym>(name, std::move(initializer), loc);
}